

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O2

Vec_Int_t * Llb_DriverCollectCs(Aig_Man_t *pAig)

{
  Vec_Int_t *p;
  void *pvVar1;
  int iVar2;
  
  p = Vec_IntAlloc(pAig->nRegs);
  for (iVar2 = 0; iVar2 < pAig->nRegs; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar2);
    Vec_IntPush(p,*(int *)((long)pvVar1 + 0x24));
  }
  return p;
}

Assistant:

Vec_Int_t * Llb_DriverCollectCs( Aig_Man_t * pAig )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj;
    int i;
    vVars = Vec_IntAlloc( Aig_ManRegNum(pAig) );
    Saig_ManForEachLo( pAig, pObj, i )
        Vec_IntPush( vVars, Aig_ObjId(pObj) );
    return vVars;
}